

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

void __thiscall exe_reconstructor::printexe(exe_reconstructor *this)

{
  o32rom *this_00;
  pointer psVar1;
  bool bVar2;
  pointer psVar3;
  pointer psVar4;
  ulong uVar5;
  ulong uVar6;
  sectioninfo_ptr local_38;
  
  e32rom::printe32((this->_e32rom).
                   super___shared_ptr<exe_reconstructor::e32rom,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  psVar3 = (this->_o32rom).
           super__Vector_base<std::shared_ptr<exe_reconstructor::o32rom>,_std::allocator<std::shared_ptr<exe_reconstructor::o32rom>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (this->_o32rom).
           super__Vector_base<std::shared_ptr<exe_reconstructor::o32rom>,_std::allocator<std::shared_ptr<exe_reconstructor::o32rom>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)(this->_sections).
            super__Vector_base<std::shared_ptr<exe_reconstructor::sectioninfo>,_std::allocator<std::shared_ptr<exe_reconstructor::sectioninfo>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->_sections).
            super__Vector_base<std::shared_ptr<exe_reconstructor::sectioninfo>,_std::allocator<std::shared_ptr<exe_reconstructor::sectioninfo>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 4 != (long)psVar4 - (long)psVar3 >> 4) {
    printf("WARNING: #sections=%d, #o32=%d\n");
    psVar3 = (this->_o32rom).
             super__Vector_base<std::shared_ptr<exe_reconstructor::o32rom>,_std::allocator<std::shared_ptr<exe_reconstructor::o32rom>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar4 = (this->_o32rom).
             super__Vector_base<std::shared_ptr<exe_reconstructor::o32rom>,_std::allocator<std::shared_ptr<exe_reconstructor::o32rom>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (psVar4 != psVar3) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      this_00 = psVar3[uVar5].
                super___shared_ptr<exe_reconstructor::o32rom,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      psVar1 = (this->_sections).
               super__Vector_base<std::shared_ptr<exe_reconstructor::sectioninfo>,_std::allocator<std::shared_ptr<exe_reconstructor::sectioninfo>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (uVar5 < (ulong)((long)(this->_sections).
                                super__Vector_base<std::shared_ptr<exe_reconstructor::sectioninfo>,_std::allocator<std::shared_ptr<exe_reconstructor::sectioninfo>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4)) {
        local_38.super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = psVar1[uVar5].
                 super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_38.super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             psVar1[uVar5].
             super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if (local_38.super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_38.super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_38.
                  super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_38.super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_38.
                  super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
      }
      else {
        local_38.super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        local_38.super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      o32rom::printo32(this_00,&local_38);
      if (local_38.super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_38.
                   super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      psVar3 = (this->_o32rom).
               super__Vector_base<std::shared_ptr<exe_reconstructor::o32rom>,_std::allocator<std::shared_ptr<exe_reconstructor::o32rom>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar2 = uVar6 < (ulong)((long)(this->_o32rom).
                                    super__Vector_base<std::shared_ptr<exe_reconstructor::o32rom>,_std::allocator<std::shared_ptr<exe_reconstructor::o32rom>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4);
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar2);
  }
  return;
}

Assistant:

void printexe() const
    {
        _e32rom->printe32();
        if (_sections.size() != _o32rom.size())
            printf("WARNING: #sections=%d, #o32=%d\n", (int)_sections.size(), (int)_o32rom.size());
        for (unsigned i= 0 ; i<_o32rom.size() ; i++) 
            _o32rom[i]->printo32(i<_sections.size() ? _sections[i] : sectioninfo_ptr());
    }